

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.h
# Opt level: O0

void __thiscall snmalloc::LocalEntropy::init<snmalloc::PALLinux>(LocalEntropy *this)

{
  enable_if_t<pal_supports<Entropy,_snmalloc::PALLinux>,_uint64_t> eVar1;
  uint64_t uVar2;
  LocalEntropy *in_RDI;
  
  eVar1 = get_entropy64<snmalloc::PALLinux>();
  in_RDI->local_key = eVar1;
  eVar1 = get_entropy64<snmalloc::PALLinux>();
  in_RDI->local_counter = eVar1;
  uVar2 = get_next(in_RDI);
  in_RDI->bit_source = uVar2;
  return;
}

Assistant:

void init()
    {
      local_key = get_entropy64<PAL>();
      local_counter = get_entropy64<PAL>();
      bit_source = get_next();
    }